

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O0

bool __thiscall
axl::zip::ZipReader::extractFileToMem(ZipReader *this,size_t index,void *p,size_t size)

{
  mz_bool mVar1;
  mz_bool result;
  char readBuffer [1024];
  void *in_stack_00002970;
  mz_uint in_stack_0000297c;
  size_t in_stack_00002980;
  void *in_stack_00002988;
  mz_uint in_stack_00002994;
  mz_zip_archive *in_stack_00002998;
  size_t in_stack_000029b0;
  undefined1 local_45d;
  uint_t in_stack_fffffffffffffbbc;
  ErrorRef *in_stack_fffffffffffffbc0;
  
  mVar1 = mz_zip_reader_extract_to_mem_no_alloc
                    (in_stack_00002998,in_stack_00002994,in_stack_00002988,in_stack_00002980,
                     in_stack_0000297c,in_stack_00002970,in_stack_000029b0);
  if (mVar1 == 0) {
    err::ErrorRef::ErrorRef(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
    local_45d = err::fail((ErrorRef *)0x169bfe);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x169c2e);
  }
  else {
    local_45d = true;
  }
  return local_45d;
}

Assistant:

bool
ZipReader::extractFileToMem(
	size_t index,
	void* p,
	size_t size
) const {
	ASSERT(isOpen());

	char readBuffer[1024];
	mz_bool result = mz_zip_reader_extract_to_mem_no_alloc(
		m_zip,
		index,
		p,
		size,
		0,
		readBuffer,
		sizeof(readBuffer)
	);

	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}